

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

void white_space(D_Parser *p,d_loc_t *loc,void **p_user_globals)

{
  char cVar1;
  byte bVar2;
  byte *pbVar3;
  ushort *puVar4;
  int iVar5;
  ushort **ppuVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  
  pbVar3 = (byte *)loc->s;
  if (*pbVar3 != 0x23) {
    pbVar7 = (byte *)0x0;
    pbVar8 = pbVar3;
    goto LAB_00143d2e;
  }
  pbVar7 = (byte *)0x0;
  pbVar8 = pbVar3;
  pbVar10 = pbVar3;
  if (loc->col != 0) goto LAB_00143d2e;
  while( true ) {
    pbVar8 = pbVar10 + 4;
    do {
      pbVar9 = pbVar8;
      pbVar8 = pbVar9 + 1;
    } while (_wspace[pbVar9[-3]] != '\0');
    pbVar9 = pbVar9 + -3;
    iVar5 = strncmp("line",(char *)pbVar9,4);
    if (iVar5 == 0) {
      cVar1 = _wspace[*pbVar8];
      while (cVar1 != '\0') {
        pbVar9 = pbVar8 + 1;
        pbVar8 = pbVar8 + 1;
        cVar1 = _wspace[*pbVar9];
        pbVar9 = pbVar8;
      }
    }
    ppuVar6 = __ctype_b_loc();
    puVar4 = *ppuVar6;
    iVar5 = 0xb;
    if ((*(byte *)((long)puVar4 + (ulong)*pbVar9 * 2 + 1) & 8) != 0) {
      iVar5 = atoi((char *)pbVar9);
      loc->line = iVar5 + -1;
      pbVar10 = pbVar9 + -2;
      do {
        pbVar8 = pbVar10 + 2;
        pbVar10 = pbVar10 + 1;
      } while ((*(byte *)((long)puVar4 + (ulong)*pbVar8 * 2 + 1) & 8) != 0);
      do {
        pbVar8 = pbVar10 + 1;
        pbVar10 = pbVar10 + 1;
      } while (_wspace[*pbVar8] != '\0');
      iVar5 = 0;
      if (*pbVar8 == 0x22) {
        loc->pathname = (char *)pbVar10;
      }
    }
    if (iVar5 != 0) break;
    for (; (pbVar8 = pbVar10, *pbVar10 != 0 && (*pbVar10 != 10)); pbVar10 = pbVar10 + 1) {
    }
LAB_00143d2e:
    do {
      while( true ) {
        do {
          pbVar10 = pbVar8;
          bVar2 = *pbVar10;
          pbVar8 = pbVar10 + 1;
        } while (_wspace[bVar2] != '\0');
        if (bVar2 != 0x2f) break;
        if (pbVar10[1] == 0x2f) {
          for (; (pbVar8 = pbVar10, *pbVar10 != 0 && (*pbVar10 != 10)); pbVar10 = pbVar10 + 1) {
          }
        }
        else {
          if (pbVar10[1] != 0x2a) goto LAB_00143dff;
          iVar5 = 0;
LAB_00143d88:
          iVar5 = iVar5 + 1;
          do {
            pbVar8 = pbVar10 + 2;
            do {
              while( true ) {
                while( true ) {
                  pbVar10 = pbVar8;
                  pbVar8 = pbVar10 + 1;
                  bVar2 = *pbVar10;
                  if (0x29 < bVar2) break;
                  if (bVar2 == 10) {
                    loc->line = loc->line + 1;
                    pbVar7 = pbVar8;
                  }
                  else if (bVar2 == 0) goto LAB_00143dff;
                }
                if (bVar2 != 0x2f) break;
                if (*pbVar8 == 0x2a) goto LAB_00143d88;
              }
            } while ((bVar2 != 0x2a) || (*pbVar8 != 0x2f));
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
          pbVar8 = pbVar10 + 2;
        }
      }
      if (bVar2 != 10) goto LAB_00143dff;
      loc->line = loc->line + 1;
      pbVar7 = pbVar10 + 1;
      pbVar9 = pbVar10 + 1;
      pbVar8 = pbVar7;
      pbVar10 = pbVar7;
    } while (*pbVar9 != 0x23);
  }
  if (iVar5 == 0xb) {
LAB_00143dff:
    if (pbVar7 == (byte *)0x0) {
      loc->col = loc->col + ((int)pbVar10 - (int)pbVar3);
    }
    else {
      loc->col = (int)pbVar10 - (int)pbVar7;
    }
    loc->s = (char *)pbVar10;
  }
  return;
}

Assistant:

static void white_space(D_Parser *p, d_loc_t *loc, void **p_user_globals) {
  uint rec = 0;
  char *s = loc->s, *scol = 0;
  (void)p;
  (void)p_user_globals;

  if (*s == '#' && loc->col == 0) {
  Ldirective : {
    char *save = s;
    s++;
    while (wspace(*s)) s++;
    if (!strncmp("line", s, 4)) {
      if (wspace(s[4])) {
        s += 5;
        while (wspace(*s)) s++;
      }
    }
    if (isdigit_(*s)) {
      loc->line = atoi(s) - 1;
      while (isdigit_(*s)) s++;
      while (wspace(*s)) s++;
      if (*s == '"') loc->pathname = s;
    } else {
      s = save;
      goto Ldone;
    }
  }
    while (*s && *s != '\n') s++;
  }
Lmore:
  while (wspace(*s)) s++;
  if (*s == '\n') {
    loc->line++;
    scol = s + 1;
    s++;
    if (*s == '#')
      goto Ldirective;
    else
      goto Lmore;
  }
  if (s[0] == '/') {
    if (s[1] == '/') {
      while (*s && *s != '\n') {
        s++;
      }
      goto Lmore;
    }
    if (s[1] == '*') {
      s += 2;
    LnestComment:
      rec++;
    LmoreComment:
      while (*s) {
        if (s[0] == '*' && s[1] == '/') {
          s += 2;
          rec--;
          if (!rec) goto Lmore;
          goto LmoreComment;
        }
        if (s[0] == '/' && s[1] == '*') {
          s += 2;
          goto LnestComment;
        }
        if (*s == '\n') {
          loc->line++;
          scol = s + 1;
        }
        s++;
      }
    }
  }
Ldone:
  if (scol)
    loc->col = s - scol;
  else
    loc->col += s - loc->s;
  loc->s = s;
  return;
}